

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O1

char * Diligent::Parsing::SkipLine<char_const*>(char **Start,char **End,bool GoToNextLine)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar3 = (byte *)*Start;
  pbVar2 = (byte *)*End;
  pbVar4 = pbVar3;
  while ((pbVar3 != pbVar2 &&
         ((0xd < *pbVar3 || (pbVar4 = pbVar3, (0x2401U >> (*pbVar3 & 0x1f) & 1) == 0))))) {
    pbVar3 = pbVar3 + 1;
    pbVar4 = pbVar2;
  }
  pbVar5 = pbVar4;
  if (((pbVar3 != pbVar2 && GoToNextLine) &&
      (((bVar1 = *pbVar4, bVar1 == 0xd || (bVar1 == 10)) &&
       (pbVar5 = pbVar4 + 1, pbVar5 != pbVar2 && bVar1 == 0xd)))) && (pbVar4[1] == 10)) {
    pbVar5 = pbVar4 + 2;
  }
  return (char *)pbVar5;
}

Assistant:

InteratorType SkipLine(const InteratorType& Start, const InteratorType& End, bool GoToNextLine = false) noexcept
{
    auto Pos = Start;
    while (Pos != End && *Pos != '\0' && !IsNewLine(*Pos))
        ++Pos;
    if (GoToNextLine && Pos != End && IsNewLine(*Pos))
    {
        ++Pos;
        if (Pos[-1] == '\r' && Pos != End && Pos[0] == '\n')
        {
            ++Pos;
            // treat \r\n as a single ending
        }
    }
    return Pos;
}